

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::LoadClosure(VirtualMachine *this)

{
  Function *fn;
  bool bVar1;
  element_type *peVar2;
  size_t index;
  Variable VVar3;
  Variable v;
  allocator<char> local_31;
  string local_30;
  VirtualMachine *local_10;
  VirtualMachine *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->stackFrame);
    fn = peVar2->function;
    index = getByteCodeParameter(this);
    VVar3 = loadClosureValue(this,fn,index);
    v.field_1 = VVar3.field_1;
    v._4_4_ = 0;
    v.type = VVar3.type;
    pushOpStack(this,v);
    advance(this);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"No stack frame found in LoadClosure",&local_31);
  panic(this,&local_30);
}

Assistant:

void runtime::VirtualMachine::LoadClosure() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in LoadClosure");
    return;
  }

  this->pushOpStack(
    this->loadClosureValue(this->stackFrame->function, this->getByteCodeParameter())
  );

  this->advance();
}